

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

int32_t define_batches(PerfProfBatch *batches)

{
  uint uVar1;
  undefined *puVar2;
  char *pcVar3;
  long lVar4;
  uint *puVar5;
  ulong uVar6;
  long lVar7;
  PerfProfBatch *pPVar8;
  int iVar9;
  ulong uVar10;
  char batch_name [256];
  char dirpath [2048];
  char local_938 [256];
  char local_838 [2056];
  
  lVar4 = 0;
  uVar10 = 0;
  do {
    puVar2 = (&PTR_anon_var_dwarf_af8_00115480)[lVar4];
    uVar6 = 0xfffffffffffffffd;
    puVar5 = &DAT_0010e9e0;
    do {
      if (3 < uVar6) {
        uVar1 = *puVar5;
        snprintf_safe(local_938,0x100,"Fractional-labeling-comparison-for-%s-scaled-%d.0",puVar2,
                      (ulong)uVar1);
        snprintf_safe(local_838,0x800,"data/BAP_Instances/last-10/CVRP-scaled-%d.0/%s",(ulong)uVar1,
                      puVar2);
        iVar9 = (int)uVar10;
        if (iVar9 < 0x800) {
          pPVar8 = batches + iVar9;
          pPVar8->max_num_procs = 0xe;
          pcVar3 = strdup(local_938);
          pPVar8->name = pcVar3;
          pPVar8->timelimit = 60.0;
          pPVar8->nseeds = 1;
          pcVar3 = strdup(local_838);
          pPVar8->dirs[0] = pcVar3;
          pPVar8->dirs[1] = (char *)0x0;
          (pPVar8->filter).family = (char *)0x0;
          (pPVar8->filter).ncustomers.a = 0;
          (pPVar8->filter).ncustomers.b = 99999;
          (pPVar8->filter).nvehicles.a = 0;
          (pPVar8->filter).nvehicles.b = 99999;
          pPVar8->solvers[0].name = "BAC MIP Pricer (EFL)";
          pPVar8->solvers[0].args[0] = "-DNUM_THREADS=1";
          memset(pPVar8->solvers[0].args + 1,0,0x7f8);
          pPVar8->solvers[1].name = "BAC MIP Pricer (AFL)";
          pPVar8->solvers[1].args[0] = "-DAMORTIZED_FRACTIONAL_LABELING=1";
          pPVar8->solvers[1].args[1] = "-DNUM_THREADS=1";
          memset(batches[iVar9].solvers[1].args + 2,0,0x7f0);
          batches[iVar9].solvers[2].name = "BAC MIP Pricer (NFL)";
          batches[iVar9].solvers[2].args[0] = "-DDISABLE_FRACTIONAL_SEPARATION=1";
          batches[iVar9].solvers[2].args[1] = "-DNUM_THREADS=1";
          memset(batches[iVar9].solvers[2].args + 2,0,0x7f0);
        }
        uVar10 = (ulong)(iVar9 + 1);
      }
      puVar5 = puVar5 + 1;
      uVar6 = uVar6 + 1;
    } while (uVar6 != 4);
    lVar4 = lVar4 + 1;
  } while (lVar4 != 5);
  lVar4 = 0;
  do {
    puVar2 = (&PTR_anon_var_dwarf_af8_00115480)[lVar4];
    uVar10 = (ulong)(int)uVar10;
    pPVar8 = batches + uVar10;
    lVar7 = 0;
    do {
      uVar1 = *(uint *)((long)&DAT_0010e9e0 + lVar7);
      snprintf_safe(local_938,0x100,"%s-scaled-%d.0",puVar2,(ulong)uVar1);
      snprintf_safe(local_838,0x800,"data/BAP_Instances/last-10/CVRP-scaled-%d.0/%s",(ulong)uVar1,
                    puVar2);
      if ((long)uVar10 < 0x800) {
        pPVar8->max_num_procs = 1;
        pcVar3 = strdup(local_938);
        pPVar8->name = pcVar3;
        pPVar8->timelimit = 10.0;
        pPVar8->nseeds = 1;
        pcVar3 = strdup(local_838);
        pPVar8->dirs[0] = pcVar3;
        pPVar8->dirs[1] = (char *)0x0;
        (pPVar8->filter).family = (char *)0x0;
        (pPVar8->filter).ncustomers.a = 0;
        (pPVar8->filter).ncustomers.b = 99999;
        (pPVar8->filter).nvehicles.a = 0;
        (pPVar8->filter).nvehicles.b = 99999;
        pPVar8->solvers[0].name = "BAC MIP Pricer (AFL)";
        pPVar8->solvers[0].args[0] = "-DAMORTIZED_FRACTIONAL_LABELING=1";
        memset(pPVar8->solvers[0].args + 1,0,0x7f8);
        memcpy(pPVar8->solvers + 1,&BAPCOD_SOLVER,0x808);
      }
      uVar10 = uVar10 + 1;
      lVar7 = lVar7 + 4;
      pPVar8 = pPVar8 + 1;
    } while (lVar7 != 0x1c);
    lVar4 = lVar4 + 1;
  } while (lVar4 != 5);
  return (int32_t)uVar10;
}

Assistant:

int32_t define_batches(PerfProfBatch *batches) {
    int32_t num_batches = 0;

    const char DIRPATH_FMT_TEMPLATE[] =
        "data/BAP_Instances/last-10/CVRP-scaled-%d.0/%s";
    const char *FAMILIES[] = {"A", "B", "F", "E", "P"};
    const int32_t SFACTORS[] = {1, 2, 4, 5, 8, 10, 20};

    //
    // Compare the EFL, AFL dual bounds on families E, F and scales {1, 2, 4}
    // with DEFAULT_TIME_LIMIT
    //
    {
        for (int32_t fidx = 0; fidx < ARRAY_LEN_i32(FAMILIES); fidx++) {

            const char *family = FAMILIES[fidx];

            for (int32_t sidx = 0; sidx < ARRAY_LEN_i32(SFACTORS); sidx++) {
                const int32_t scale_factor = SFACTORS[sidx];

                if (scale_factor > 4) {
                    continue;
                }

                char batch_name[256];
                char dirpath[2048];

                snprintf_safe(
                    batch_name, ARRAY_LEN(batch_name),
                    "Fractional-labeling-comparison-for-%s-scaled-%d.0", family,
                    scale_factor);

                snprintf_safe(dirpath, ARRAY_LEN(dirpath), DIRPATH_FMT_TEMPLATE,
                              scale_factor, family);

                if (num_batches < MAX_NUM_BATCHES) {
                    batches[num_batches].max_num_procs = 14;
                    batches[num_batches].name = strdup(batch_name);
                    batches[num_batches].timelimit = 60;
                    batches[num_batches].nseeds = 1;
                    batches[num_batches].dirs[0] = strdup(dirpath);
                    batches[num_batches].dirs[1] = NULL;
                    batches[num_batches].filter = DEFAULT_FILTER;

                    int32_t num_solvers = 0;
                    batches[num_batches].solvers[num_solvers++] =
                        (PerfProfSolver){"BAC MIP Pricer (EFL)",
                                         {"-DNUM_THREADS=1"}};
                    batches[num_batches].solvers[num_solvers++] =
                        (PerfProfSolver){"BAC MIP Pricer (AFL)",
                                         {"-DAMORTIZED_FRACTIONAL_LABELING=1",
                                          "-DNUM_THREADS=1"}};
                    batches[num_batches].solvers[num_solvers++] =
                        (PerfProfSolver){"BAC MIP Pricer (NFL)",
                                         {"-DDISABLE_FRACTIONAL_SEPARATION=1",
                                          "-DNUM_THREADS=1"}};
                }
                ++num_batches;
            }
        }
    }

    //
    // Compare the BAC MIP Pricer (AFL) against BapCod with DEFAULT_TIME_LIMIT
    //
    {
        for (int32_t fidx = 0; fidx < ARRAY_LEN_i32(FAMILIES); fidx++) {

            const char *family = FAMILIES[fidx];
            for (int32_t sidx = 0; sidx < ARRAY_LEN_i32(SFACTORS); sidx++) {

                const int32_t scale_factor = SFACTORS[sidx];
                if (scale_factor > 20) {
                    continue;
                }

                char batch_name[256];
                char dirpath[2048];

                snprintf_safe(batch_name, ARRAY_LEN(batch_name),
                              "%s-scaled-%d.0", family, scale_factor);

                snprintf_safe(dirpath, ARRAY_LEN(dirpath), DIRPATH_FMT_TEMPLATE,
                              scale_factor, family);

                if (num_batches < MAX_NUM_BATCHES) {
                    batches[num_batches].max_num_procs = 1;
                    batches[num_batches].name = strdup(batch_name);
                    batches[num_batches].timelimit = DEFAULT_TIME_LIMIT;
                    batches[num_batches].nseeds = 1;
                    batches[num_batches].dirs[0] = strdup(dirpath);
                    batches[num_batches].dirs[1] = NULL;
                    batches[num_batches].filter = DEFAULT_FILTER;

                    int32_t num_solvers = 0;
                    batches[num_batches].solvers[num_solvers++] =
                        (PerfProfSolver){"BAC MIP Pricer (AFL)",
                                         {"-DAMORTIZED_FRACTIONAL_LABELING=1"}};
                    batches[num_batches].solvers[num_solvers++] = BAPCOD_SOLVER;
                }
                ++num_batches;
            }
        }
    }

    return num_batches;
}